

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdConfigDirWrapper.cpp
# Opt level: O2

bufsize_t __thiscall LdConfigDirWrapper::getHdrDefinedSize(LdConfigDirWrapper *this)

{
  Executable *pEVar1;
  int iVar2;
  int iVar3;
  offset_t oVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bufsize_t bVar5;
  long lVar6;
  CustomException anon_var_0;
  
  oVar4 = DataDirEntryWrapper::getDirEntryAddress(&this->super_DataDirEntryWrapper);
  pEVar1 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
           super_ExeElementWrapper.m_Exe;
  iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x1a])(pEVar1,oVar4);
  if (CONCAT44(extraout_var,iVar2) == -1) {
    bVar5 = 0;
  }
  else {
    iVar3 = (*(((this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                super_ExeElementWrapper.m_Exe)->super_AbstractByteBuffer)._vptr_AbstractByteBuffer
              [0xb])();
    if (iVar3 == 0x20) {
      lVar6 = 0;
    }
    else {
      iVar3 = (*(((this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                  super_ExeElementWrapper.m_Exe)->super_AbstractByteBuffer)._vptr_AbstractByteBuffer
                [0xb])();
      lVar6 = -(ulong)(iVar3 != 0x40);
    }
    pEVar1 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
             super_ExeElementWrapper.m_Exe;
    bVar5 = 0;
    iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[7])
                      (pEVar1,lVar6 + CONCAT44(extraout_var,iVar2),4,0);
    if ((uint *)CONCAT44(extraout_var_00,iVar2) != (uint *)0x0) {
      bVar5 = (bufsize_t)*(uint *)CONCAT44(extraout_var_00,iVar2);
    }
  }
  return bVar5;
}

Assistant:

bufsize_t LdConfigDirWrapper::getHdrDefinedSize()
{
    const offset_t rva = getDirEntryAddress();
    offset_t raw = INVALID_ADDR;
    try {
        raw = m_Exe->rvaToRaw(rva);
    } catch (CustomException) {
        raw = INVALID_ADDR;
    }
    if (raw == INVALID_ADDR) return 0;
    
    offset_t offset = INVALID_ADDR;
    
    if (m_Exe->getBitMode() == Executable::BITS_32) {
        pe::IMAGE_LOAD_CONFIG_DIRECTORY32 ld = { 0 };
        offset = getStructFieldOffset(ld, Size);

    } else if (m_Exe->getBitMode() == Executable::BITS_64) {
        pe::IMAGE_LOAD_CONFIG_DIRECTORY64 ld = { 0 };
        offset = getStructFieldOffset(ld, Size);
    }
    DWORD* sizePtr = (DWORD*) m_Exe->getContentAt((raw + offset), sizeof(DWORD));
    if (!sizePtr) return 0;
    return bufsize_t(*sizePtr);
}